

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void asciiFold(char *aOut,char *aIn,int nByte)

{
  char c;
  int i;
  int nByte_local;
  char *aIn_local;
  char *aOut_local;
  
  for (i = 0; i < nByte; i = i + 1) {
    c = aIn[i];
    if (('@' < c) && (c < '[')) {
      c = c + ' ';
    }
    aOut[i] = c;
  }
  return;
}

Assistant:

static void asciiFold(char *aOut, const char *aIn, int nByte){
  int i;
  for(i=0; i<nByte; i++){
    char c = aIn[i];
    if( c>='A' && c<='Z' ) c += 32;
    aOut[i] = c;
  }
}